

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O3

int client_handle_certificate_request
              (ptls_t *tls,ptls_iovec_t message,ptls_handshake_properties_t *properties)

{
  byte bVar1;
  st_ptls_on_extension_t *psVar2;
  ptls_key_schedule_t *ppVar3;
  ushort uVar4;
  ushort uVar5;
  ushort uVar6;
  int iVar7;
  uint8_t *__dest;
  size_t sVar8;
  uint8_t *puVar9;
  ushort *puVar10;
  size_t __size;
  ulong uVar11;
  ushort *puVar12;
  ushort *puVar13;
  size_t sVar14;
  size_t len;
  ptls_hash_context_t **pppVar15;
  ptls_iovec_t pVar16;
  byte local_60 [8];
  ushort *local_58;
  st_ptls_signature_algorithms_t *local_50;
  ushort *local_48;
  ushort *local_40;
  uint8_t *local_38;
  
  sVar8 = message.len;
  puVar9 = message.base;
  iVar7 = 0x32;
  if ((sVar8 != 4) && (uVar11 = (ulong)puVar9[4], uVar11 <= sVar8 - 5)) {
    __size = 1;
    if (uVar11 != 0) {
      __size = uVar11;
    }
    __dest = (uint8_t *)malloc(__size);
    (tls->field_20).client.certificate_request.context.base = __dest;
    if (__dest == (uint8_t *)0x0) {
      iVar7 = 0x201;
    }
    else {
      puVar10 = (ushort *)(puVar9 + sVar8);
      puVar12 = (ushort *)(puVar9 + 5 + uVar11);
      *(ulong *)((long)&tls->field_20 + 0x38) = uVar11;
      local_38 = puVar9;
      memcpy(__dest,puVar9 + 5,uVar11);
      local_60[0] = 1;
      local_60[1] = 4;
      local_60[2] = 1;
      local_60[3] = 0;
      local_60[4] = 0;
      local_60[5] = 0x3e;
      local_60[6] = 8;
      local_60[7] = 0;
      iVar7 = 0x32;
      if (1 < (ulong)((long)puVar10 - (long)puVar12)) {
        uVar11 = (ulong)(ushort)(*puVar12 << 8 | *puVar12 >> 8);
        puVar12 = puVar12 + 1;
        if (uVar11 <= (ulong)((long)puVar10 - (long)puVar12)) {
          puVar13 = puVar12;
          if (uVar11 != 0) {
            local_50 = &(tls->field_20).client.certificate_request.signature_algorithms;
            local_48 = (ushort *)(uVar11 + (long)puVar12);
            local_40 = puVar10;
            do {
              puVar10 = local_48;
              if ((long)local_48 - (long)puVar12 < 2) {
                return 0x32;
              }
              uVar5 = *puVar12;
              bVar1 = *(byte *)((long)puVar12 + 1);
              uVar4 = CONCAT11((char)uVar5,bVar1);
              if (uVar4 < 0x40) {
                if ((local_60[uVar4 >> 3] >> (uVar4 & 7) & 1) != 0) {
                  return 0x2f;
                }
                local_60[bVar1 >> 3] = local_60[bVar1 >> 3] | '\x01' << (bVar1 & 7);
              }
              if ((ulong)((long)puVar10 - (long)(puVar12 + 1)) < 2) {
                return 0x32;
              }
              uVar6 = puVar12[1] << 8 | puVar12[1] >> 8;
              puVar12 = puVar12 + 2;
              if ((ulong)((long)puVar10 - (long)puVar12) < (ulong)uVar6) {
                return 0x32;
              }
              psVar2 = tls->ctx->on_extension;
              local_58 = puVar12;
              if ((psVar2 != (st_ptls_on_extension_t *)0x0) &&
                 (pVar16.len._0_2_ = uVar6, pVar16.base = (uint8_t *)puVar12, pVar16.len._2_6_ = 0,
                 iVar7 = (*psVar2->cb)(psVar2,tls,'\r',CONCAT11((char)uVar5,bVar1),pVar16),
                 iVar7 != 0)) {
                return 1;
              }
              puVar12 = (ushort *)((long)puVar12 + (ulong)uVar6);
              if ((uVar4 == 0xd) &&
                 (iVar7 = decode_signature_algorithms
                                    (local_50,(uint8_t **)&local_58,(uint8_t *)puVar12), iVar7 != 0)
                 ) {
                return iVar7;
              }
              local_58 = puVar12;
              puVar10 = local_40;
              puVar13 = local_48;
            } while (puVar12 != local_48);
          }
          puVar9 = local_38;
          iVar7 = 0x32;
          if (puVar13 == puVar10) {
            if ((tls->field_20).client.certificate_request.signature_algorithms.count == 0) {
              iVar7 = 0x6d;
            }
            else {
              iVar7 = 0x2f;
              if ((tls->field_20).client.certificate_request.context.len == 0) {
                tls->state = PTLS_STATE_CLIENT_EXPECT_CERTIFICATE;
                ppVar3 = tls->key_schedule;
                iVar7 = 0x202;
                if (ppVar3->num_hashes != 0) {
                  pppVar15 = &ppVar3->hashes[0].ctx;
                  sVar14 = 0;
                  do {
                    (*(*pppVar15)->update)(*pppVar15,puVar9,sVar8);
                    sVar14 = sVar14 + 1;
                    pppVar15 = pppVar15 + 2;
                  } while (sVar14 != ppVar3->num_hashes);
                }
              }
            }
          }
        }
      }
    }
  }
  return iVar7;
}

Assistant:

static int client_handle_certificate_request(ptls_t *tls, ptls_iovec_t message, ptls_handshake_properties_t *properties)
{
    const uint8_t *src = message.base + PTLS_HANDSHAKE_HEADER_SIZE, *const end = message.base + message.len;
    int ret = 0;

    if ((ret = decode_certificate_request(tls, &tls->client.certificate_request, src, end)) != 0)
        return ret;

    /* This field SHALL be zero length unless used for the post-handshake authentication exchanges (section 4.3.2) */
    if (tls->client.certificate_request.context.len != 0)
        return PTLS_ALERT_ILLEGAL_PARAMETER;

    tls->state = PTLS_STATE_CLIENT_EXPECT_CERTIFICATE;
    ptls__key_schedule_update_hash(tls->key_schedule, message.base, message.len);

    return PTLS_ERROR_IN_PROGRESS;
}